

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O2

ctl_arena_t * arenas_i_impl(tsd_t *tsd,size_t i,_Bool compat,_Bool init)

{
  ctl_arenas_t *pcVar1;
  uint uVar2;
  base_t *base;
  ctl_arena_t *pcVar3;
  
  pcVar1 = ctl_arenas;
  uVar2 = arenas_i2a_impl(i,compat,false);
  pcVar3 = pcVar1->duckdb_je_arenas[uVar2];
  if (pcVar3 == (ctl_arena_t *)0x0 && init) {
    base = duckdb_je_b0get();
    pcVar3 = (ctl_arena_t *)duckdb_je_base_alloc((tsdn_t *)tsd,base,0x9870,0x10);
    if (pcVar3 == (ctl_arena_t *)0x0) {
      pcVar3 = (ctl_arena_t *)0x0;
    }
    else {
      pcVar3->astats = (ctl_arena_stats_t *)(pcVar3 + 1);
      pcVar3->arena_ind = (uint)i;
      pcVar1 = ctl_arenas;
      uVar2 = arenas_i2a_impl(i,compat,false);
      pcVar1->duckdb_je_arenas[uVar2] = pcVar3;
    }
  }
  return pcVar3;
}

Assistant:

static ctl_arena_t *
arenas_i_impl(tsd_t *tsd, size_t i, bool compat, bool init) {
	ctl_arena_t *ret;

	assert(!compat || !init);

	ret = ctl_arenas->arenas[arenas_i2a_impl(i, compat, false)];
	if (init && ret == NULL) {
		if (config_stats) {
			struct container_s {
				ctl_arena_t		ctl_arena;
				ctl_arena_stats_t	astats;
			};
			struct container_s *cont =
			    (struct container_s *)base_alloc(tsd_tsdn(tsd),
			    b0get(), sizeof(struct container_s), QUANTUM);
			if (cont == NULL) {
				return NULL;
			}
			ret = &cont->ctl_arena;
			ret->astats = &cont->astats;
		} else {
			ret = (ctl_arena_t *)base_alloc(tsd_tsdn(tsd), b0get(),
			    sizeof(ctl_arena_t), QUANTUM);
			if (ret == NULL) {
				return NULL;
			}
		}
		ret->arena_ind = (unsigned)i;
		ctl_arenas->arenas[arenas_i2a_impl(i, compat, false)] = ret;
	}

	assert(ret == NULL || arenas_i2a(ret->arena_ind) == arenas_i2a(i));
	return ret;
}